

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O0

uint Dau_DecReadSet(char *pStr)

{
  uint uVar1;
  int local_18;
  uint local_14;
  int v;
  uint uSet;
  char *pStr_local;
  
  local_14 = 0;
  local_18 = 0;
  do {
    if (pStr[local_18] == '\0') {
      return local_14;
    }
    if ((pStr[local_18] < 'a') || ('z' < pStr[local_18])) {
      if (pStr[local_18] < 'A') {
        return local_14;
      }
      if ('Z' < pStr[local_18]) {
        return local_14;
      }
      uVar1 = 1 << ((pStr[local_18] + -0x61) * '\x02' & 0x1fU) |
              1 << ((pStr[local_18] + -0x61) * '\x02' + 1U & 0x1f);
    }
    else {
      uVar1 = 1 << ((pStr[local_18] + -0x61) * '\x02' & 0x1fU);
    }
    local_14 = uVar1 | local_14;
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

unsigned Dau_DecReadSet( char * pStr )
{
    unsigned uSet = 0; int v;
    for ( v = 0; pStr[v]; v++ )
    {
        if ( pStr[v] >= 'a' && pStr[v] <= 'z' )
            uSet |= (1 << ((pStr[v] - 'a') << 1));
        else if ( pStr[v] >= 'A' && pStr[v] <= 'Z' )
            uSet |= (1 << ((pStr[v] - 'a') << 1)) | (1 << (((pStr[v] - 'a') << 1)+1));
        else break;
    }
    return uSet;
}